

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O0

int minTemp2_fast(word *pInOut,int iVar,int iQ,int jQ,int nWords,int *pDifStart)

{
  char cVar1;
  int iVar2;
  ulong x;
  word temp;
  int blockSize;
  int i;
  int *pDifStart_local;
  int nWords_local;
  int jQ_local;
  int iQ_local;
  int iVar_local;
  word *pInOut_local;
  
  iVar2 = 1 << ((byte)iVar & 0x1f);
  temp._4_4_ = nWords + -1;
  while( true ) {
    if (temp._4_4_ < 0) {
      *pDifStart = 0;
      return 0;
    }
    if (0x3f < jQ * iVar2) break;
    cVar1 = (char)iVar2;
    x = (pInOut[temp._4_4_] & SFmask[iVar][iQ]) << ((char)iQ * cVar1 & 0x3fU) ^
        (pInOut[temp._4_4_] & SFmask[iVar][jQ]) << ((char)jQ * cVar1 & 0x3fU);
    if (x != 0) {
      iVar2 = firstShiftWithOneBit(x,iVar2);
      *pDifStart = (temp._4_4_ * 100 + 0x14) - iVar2;
      if ((pInOut[temp._4_4_] & SFmask[iVar][iQ]) << ((char)iQ * cVar1 & 0x3fU) <=
          (pInOut[temp._4_4_] & SFmask[iVar][jQ]) << ((char)jQ * cVar1 & 0x3fU)) {
        return 0;
      }
      return 1;
    }
    temp._4_4_ = temp._4_4_ + -1;
  }
  __assert_fail("jQ*blockSize < 64",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/lucky/luckyFast16.c"
                ,0xbc,"int minTemp2_fast(word *, int, int, int, int, int *)");
}

Assistant:

int minTemp2_fast(word* pInOut, int iVar, int iQ, int jQ, int nWords, int* pDifStart)
{
    int i, blockSize = 1<<iVar;
    word temp;
    for(i=nWords - 1; i>=0; i--)
    {
        assert( jQ*blockSize < 64 );
        temp = ((pInOut[i] & SFmask[iVar][iQ])<<(iQ*blockSize)) ^ ((pInOut[i] & SFmask[iVar][jQ])<<(jQ*blockSize));
        if( temp == 0)
            continue;
        else
        {
            *pDifStart = i*100 + 20 - firstShiftWithOneBit(temp, blockSize);
            if( ((pInOut[i] & SFmask[iVar][iQ])<<(iQ*blockSize)) <= ((pInOut[i] & SFmask[iVar][jQ])<<(jQ*blockSize)) )
                return 0;
            else
                return 1;
        }
    }
    *pDifStart=0;
    return 0;
}